

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUnexpectedCommand.h
# Opt level: O0

cmCommand * __thiscall cmUnexpectedCommand::Clone(cmUnexpectedCommand *this)

{
  cmUnexpectedCommand *this_00;
  string local_30;
  cmUnexpectedCommand *local_10;
  cmUnexpectedCommand *this_local;
  
  local_10 = this;
  this_00 = (cmUnexpectedCommand *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_30,(string *)&this->Name);
  cmUnexpectedCommand(this_00,&local_30,this->Error);
  std::__cxx11::string::~string((string *)&local_30);
  return &this_00->super_cmCommand;
}

Assistant:

cmCommand* Clone() override
  {
    return new cmUnexpectedCommand(this->Name, this->Error);
  }